

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# real.cpp
# Opt level: O0

void real_test(void)

{
  bool bVar1;
  value_type_conflict1 vVar2;
  value_type_conflict2 vVar3;
  real_ local_e;
  real_ local_d;
  real_ local_c;
  real_ local_b;
  real_ local_a;
  real_ local_9;
  
  vVar2 = brigand::real_::operator_cast_to_float(&local_9);
  if ((vVar2 != 0.0) || (NAN(vVar2))) {
    __assert_fail("static_cast<float>(single_zero()) == 0.f",
                  "/workspace/llm4binary/github/license_c_cmakelists/edouarda[P]brigand/test/real.cpp"
                  ,0x18,"void real_test()");
  }
  vVar2 = brigand::real_::operator_cast_to_float(&local_a);
  if ((vVar2 == 1.0) && (!NAN(vVar2))) {
    vVar2 = brigand::real_::operator_cast_to_float(&local_b);
    bVar1 = is_nan<float>(vVar2);
    if (!bVar1) {
      __assert_fail("is_nan(static_cast<float>(single_nan()))",
                    "/workspace/llm4binary/github/license_c_cmakelists/edouarda[P]brigand/test/real.cpp"
                    ,0x1a,"void real_test()");
    }
    vVar3 = brigand::real_::operator_cast_to_double(&local_c);
    if ((vVar3 == 0.0) && (!NAN(vVar3))) {
      vVar3 = brigand::real_::operator_cast_to_double(&local_d);
      if ((vVar3 == 1.0) && (!NAN(vVar3))) {
        vVar3 = brigand::real_::operator_cast_to_double(&local_e);
        bVar1 = is_nan<double>(vVar3);
        if (!bVar1) {
          __assert_fail("is_nan(static_cast<double>(double_nan()))",
                        "/workspace/llm4binary/github/license_c_cmakelists/edouarda[P]brigand/test/real.cpp"
                        ,0x1f,"void real_test()");
        }
        return;
      }
      __assert_fail("static_cast<double>(double_one()) == 1.",
                    "/workspace/llm4binary/github/license_c_cmakelists/edouarda[P]brigand/test/real.cpp"
                    ,0x1e,"void real_test()");
    }
    __assert_fail("static_cast<double>(double_zero()) == 0.",
                  "/workspace/llm4binary/github/license_c_cmakelists/edouarda[P]brigand/test/real.cpp"
                  ,0x1d,"void real_test()");
  }
  __assert_fail("static_cast<float>(single_one()) == 1.f",
                "/workspace/llm4binary/github/license_c_cmakelists/edouarda[P]brigand/test/real.cpp"
                ,0x19,"void real_test()");
}

Assistant:

void real_test()
{
  // test single cases
  assert( static_cast<float>(single_zero()) == 0.f);
  assert( static_cast<float>(single_one())  == 1.f);
  assert( is_nan(static_cast<float>(single_nan())) );

  // test double
  assert( static_cast<double>(double_zero()) == 0.);
  assert( static_cast<double>(double_one())  == 1.);
  assert( is_nan(static_cast<double>(double_nan())) );
}